

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O0

string * pybind11::type_id<char_const(&)[9]>(void)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000020;
  string *name;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  string *__s;
  
  uVar1 = 0;
  __s = in_RDI;
  std::type_info::name((type_info *)&char_[9]::typeinfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (unaff_retaddr,(char *)__s,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffff0))
  ;
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff6);
  detail::clean_type_id(in_stack_00000020);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}